

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.h
# Opt level: O0

void __thiscall VCTools::InputParser::InputParser(InputParser *this,int argc,char **argv)

{
  long in_RDX;
  int in_ESI;
  value_type *in_RDI;
  int i;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x27afa1);
  for (local_1c = 1; local_1c < local_c; local_1c = local_1c + 1) {
    this_00 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                **)(local_18 + (long)local_1c * 8);
    __x = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,(char *)this_00,&local_41);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,__x);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

InputParser(int argc, char** argv) {
			for (int i = 1; i < argc; ++i)
				this->tokens.push_back(string(argv[i]));
		}